

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_unix.cpp
# Opt level: O2

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  uint in_ECX;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  std::__cxx11::string::assign((char *)&this->m_name);
  if (*(int *)&this->m_impl != -1) {
    (*(this->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3])(this);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__file,&local_69);
  extractFileDir(&local_68,&local_48);
  createDir(&local_68,true);
  uVar1 = anon_unknown.dwarf_38976e::makeUnixOpenFlags(__oflag);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = open64(__file,uVar1 | in_ECX,0x1b0);
  this->m_impl = (void *)(long)iVar2;
  return (int)CONCAT71((int7)(int3)((uint)iVar2 >> 8),iVar2 != -1);
}

Assistant:

bool File::open(const char* fName, unsigned int oflag, unsigned int systemDependentFlags)
{
    m_name = fName;

    if (isOpen())
        close();

    int sysFlags = makeUnixOpenFlags(oflag);
    createDir(extractFileDir(fName), true);
    auto fd = ::open(fName, sysFlags | systemDependentFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP);
    m_impl = from_fd(fd);
    return fd != -1;
}